

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# retention_test.cc
# Opt level: O0

void __thiscall
google::protobuf::internal::anon_unknown_0::RetentionTest_Field_Test::TestBody
          (RetentionTest_Field_Test *this)

{
  Descriptor *this_00;
  FieldDescriptor *this_01;
  FieldOptions *this_02;
  ConstType options;
  RetentionTest_Field_Test *this_local;
  
  this_00 = proto2_unittest::TopLevelMessage::descriptor();
  this_01 = Descriptor::field(this_00,0);
  this_02 = FieldDescriptor::options(this_01);
  options = FieldOptions::
            GetExtension<google::protobuf::internal::MessageTypeTraits<proto2_unittest::OptionsMessage>,_(unsigned_char)__v_,_false,_0>
                      (this_02,(ExtensionIdentifier<google::protobuf::FieldOptions,_google::protobuf::internal::MessageTypeTraits<proto2_unittest::OptionsMessage>,_(unsigned_char)__v_,_false>
                                *)proto2_unittest::field_option);
  CheckOptionsMessageIsStrippedCorrectly(options);
  return;
}

Assistant:

TEST(RetentionTest, Field) {
  CheckOptionsMessageIsStrippedCorrectly(
      proto2_unittest::TopLevelMessage::descriptor()
          ->field(0)
          ->options()
          .GetExtension(proto2_unittest::field_option));
}